

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AsmJsModule.cpp
# Opt level: O3

bool __thiscall Js::AsmJsModuleCompiler::CommitModule(AsmJsModuleCompiler *this)

{
  undefined1 *puVar1;
  char cVar2;
  RegSlot RVar3;
  RegSlot RVar4;
  Type TVar5;
  FuncInfo *this_00;
  ByteCodeGenerator *this_01;
  uint *puVar6;
  AsmJsSymbol *sym;
  code *pcVar7;
  int i;
  int i_00;
  int i_01;
  Type TVar8;
  Type TVar9;
  Type TVar10;
  Type TVar11;
  Type TVar12;
  Type TVar13;
  Type TVar14;
  bool bVar15;
  Which WVar16;
  type_info tVar17;
  int iVar18;
  FunctionBody *pFVar19;
  AsmJsModuleInfo *pAVar20;
  undefined4 *puVar21;
  IdentPtr pid;
  AsmJsFunctionDeclaration *this_02;
  EntryType *pEVar22;
  AsmJsSymbol **ppAVar23;
  Recycler *alloc;
  AsmJsVar *pAVar24;
  ModuleVar *pMVar25;
  AsmJsModuleArg *pAVar26;
  AsmJsImportFunction *pAVar27;
  ModuleFunctionImport *pMVar28;
  AsmJsFunctionTable *pAVar29;
  ModuleFunctionTable *pMVar30;
  Type *pTVar31;
  AsmJsConstantImport *pAVar32;
  ModuleVarImport *pMVar33;
  AsmJsMathConst *pAVar34;
  AsmJsFunc *pAVar35;
  ModuleFunction *pMVar36;
  AsmJsMathFunction *pAVar37;
  ParseNodeVar *this_03;
  uint uVar38;
  int index;
  int iVar39;
  ulong uVar40;
  undefined1 local_d8 [8];
  EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
  exportIter;
  undefined **local_98;
  AsmJsSlot *slot;
  size_t local_88;
  char *local_80;
  DWORD local_78;
  int local_70;
  Type local_6c;
  FuncInfo *local_68;
  FunctionBody *local_60;
  AsmJsModuleCompiler *local_58;
  undefined4 *local_50;
  int local_44;
  AsmJsModuleInfo *local_40;
  int local_38;
  PropertyId local_34;
  
  this_00 = this->mModuleFunctionNode->funcInfo;
  pFVar19 = FuncInfo::GetParsedFunctionBody(this_00);
  pAVar20 = FunctionBody::AllocateAsmJsModuleInfo(pFVar19);
  local_68 = this_00;
  if (((this_00->byteCodeFunction->super_FunctionProxy).field_0x45 & 0x20) != 0) {
    this_03 = this->mModuleFunctionNode->pnodeName;
    if (this_03 == (ParseNodeVar *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar21 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar21 = 1;
      bVar15 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsModule.cpp"
                                   ,0x7e,"(GetModuleFunctionNode()->pnodeName)",
                                   "GetModuleFunctionNode()->pnodeName");
      if (!bVar15) goto LAB_0094671e;
      *puVar21 = 0;
      this_03 = this->mModuleFunctionNode->pnodeName;
    }
    if ((this_03->super_ParseNode).nop != knopVarDecl) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar21 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar21 = 1;
      bVar15 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsModule.cpp"
                                   ,0x7f,"(GetModuleFunctionNode()->pnodeName->nop == knopVarDecl)",
                                   "GetModuleFunctionNode()->pnodeName->nop == knopVarDecl");
      if (!bVar15) {
LAB_0094671e:
        pcVar7 = (code *)invalidInstructionException();
        (*pcVar7)();
      }
      *puVar21 = 0;
      this_03 = this->mModuleFunctionNode->pnodeName;
    }
    bVar15 = Symbol::IsInSlot(this_03->sym,this->mCx->byteCodeGenerator,this_00,false);
    if (bVar15) {
      this_01 = this->mCx->byteCodeGenerator;
      pid = ParseNode::name(&this_03->super_ParseNode);
      ByteCodeGenerator::AssignPropertyId(this_01,pid);
      this_02 = (AsmJsFunctionDeclaration *)
                new<Memory::ArenaAllocator>(0x38,&this->mAllocator,0x364470);
      AsmJsFunctionDeclaration::AsmJsFunctionDeclaration
                (this_02,this_03->pid,ClosureFunction,&this->mAllocator);
      (this_02->super_AsmJsSymbol)._vptr_AsmJsSymbol = (_func_int **)&PTR_GetType_014e8ca0;
      DefineIdentifier(this,this_03->pid,(AsmJsSymbol *)this_02);
    }
  }
  uVar38 = 3;
  if ((this->mBufferArgName == (PropertyName)0x0) &&
     (uVar38 = 2, this->mForeignArgName == (PropertyName)0x0)) {
    uVar38 = (uint)(this->mStdLibArgName != (PropertyName)0x0);
  }
  iVar39 = (this->mFunctionTableArray).
           super_ReadOnlyList<Js::AsmJsFunctionTable_*,_Memory::ArenaAllocator,_DefaultComparer>.
           count;
  RVar3 = (this->mImportFunctions).mRegisterCount;
  RVar4 = (this->mImportFunctions).mNbConst;
  local_60 = pFVar19;
  local_40 = pAVar20;
  AsmJsModuleInfo::SetFunctionCount
            (pAVar20,(this->mFunctionArray).
                     super_ReadOnlyList<Js::AsmJsFunc_*,_Memory::ArenaAllocator,_DefaultComparer>.
                     count);
  AsmJsModuleInfo::SetFunctionTableCount(pAVar20,iVar39);
  AsmJsModuleInfo::SetFunctionImportCount(pAVar20,RVar3 - RVar4);
  AsmJsModuleInfo::SetVarCount(pAVar20,this->mVarCount);
  AsmJsModuleInfo::SetVarImportCount(pAVar20,this->mVarImportCount);
  pFVar19 = local_60;
  pAVar20->mArgInCount = uVar38;
  TVar8 = (this->mModuleMemory).mStdLibOffset;
  TVar9 = (this->mModuleMemory).mDoubleOffset;
  TVar10 = (this->mModuleMemory).mFuncOffset;
  TVar11 = (this->mModuleMemory).mFFIOffset;
  TVar12 = (this->mModuleMemory).mFuncPtrOffset;
  TVar13 = (this->mModuleMemory).mIntOffset;
  TVar14 = (this->mModuleMemory).mFloatOffset;
  (pAVar20->mModuleMemory).mArrayBufferOffset = (this->mModuleMemory).mArrayBufferOffset;
  (pAVar20->mModuleMemory).mStdLibOffset = TVar8;
  (pAVar20->mModuleMemory).mDoubleOffset = TVar9;
  (pAVar20->mModuleMemory).mFuncOffset = TVar10;
  (pAVar20->mModuleMemory).mFFIOffset = TVar11;
  (pAVar20->mModuleMemory).mFuncPtrOffset = TVar12;
  (pAVar20->mModuleMemory).mIntOffset = TVar13;
  (pAVar20->mModuleMemory).mFloatOffset = TVar14;
  (pAVar20->mModuleMemory).mMemorySize = (this->mModuleMemory).mMemorySize;
  (pAVar20->mAsmMathBuiltinUsed).data[0].word = (this->mAsmMathBuiltinUsedBV).data[0].word;
  (pAVar20->mAsmArrayBuiltinUsed).data[0].word = (this->mAsmArrayBuiltinUsedBV).data[0].word;
  pAVar20->mMaxHeapAccess = this->mMaxHeapAccess;
  ParseableFunctionInfo::SetInParamsCount(&local_60->super_ParseableFunctionInfo,4);
  ParseableFunctionInfo::SetReportedInParamsCount(&pFVar19->super_ParseableFunctionInfo,4);
  FunctionBody::CheckAndSetConstantCount(pFVar19,2);
  FunctionBody::CreateConstantTable(pFVar19);
  FunctionBody::CheckAndSetVarCount(pFVar19,3);
  puVar1 = &(pFVar19->super_ParseableFunctionInfo).super_FunctionProxy.field_0x46;
  *puVar1 = *puVar1 | 2;
  puVar1 = &(pFVar19->super_ParseableFunctionInfo).super_FunctionProxy.field_0x47;
  *puVar1 = *puVar1 | 0x40;
  FunctionBody::NewObjectLiteral(pFVar19);
  AsmJSByteCodeGenerator::EmitEmptyByteCode
            (local_68,this->mCx->byteCodeGenerator,&this->mModuleFunctionNode->super_ParseNode);
  pAVar20->mExportFunctionIndex = this->mExportFuncIndex;
  AsmJsModuleInfo::SetExportsCount(pAVar20,(this->mExports).count - (this->mExports).freeCount);
  JsUtil::
  BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  ::
  EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
  ::EntryIterator((EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                   *)local_d8,&this->mExports);
  bVar15 = JsUtil::
           BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
           ::
           EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
           ::IsValid((EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                      *)local_d8);
  local_58 = this;
  if (bVar15) {
    iVar39 = 0;
    do {
      pEVar22 = JsUtil::
                BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                ::
                IteratorBase<JsUtil::BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
                ::Current((IteratorBase<JsUtil::BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
                           *)local_d8);
      puVar6 = (pAVar20->mExportsFunctionLocation).ptr;
      (&(pAVar20->mExports).ptr[1].count)[iVar39] =
           (pEVar22->
           super_DefaultHashedEntry<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_JsUtil::(anonymous_namespace)::KeyValueEntry>
           ).super_KeyValueEntry<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport>.
           super_ValueEntry<Js::AsmJsModuleCompiler::AsmJsModuleExport,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport>_>
           .super_KeyValueEntryDataLayout2<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport>.value.id
      ;
      puVar6[iVar39] =
           (pEVar22->
           super_DefaultHashedEntry<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_JsUtil::(anonymous_namespace)::KeyValueEntry>
           ).super_KeyValueEntry<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport>.
           super_ValueEntry<Js::AsmJsModuleCompiler::AsmJsModuleExport,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport>_>
           .super_KeyValueEntryDataLayout2<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport>.value.
           location;
      JsUtil::
      BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
      ::
      EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
      ::MoveNext((EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                  *)local_d8);
      iVar39 = iVar39 + 1;
      bVar15 = JsUtil::
               BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
               ::
               EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
               ::IsValid((EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>
                          *)local_d8);
    } while (bVar15);
  }
  iVar39 = (local_58->mModuleEnvironment).count - (local_58->mModuleEnvironment).freeCount;
  AsmJsModuleInfo::InitializeSlotMap(pAVar20,iVar39);
  if (0 < iVar39) {
    local_60 = (FunctionBody *)&local_58->mModuleEnvironment;
    exportIter.
    super_IteratorBase<JsUtil::BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
    ._24_8_ = (local_40->mSlotMap).ptr;
    local_50 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    local_44 = 0;
    i_00 = 0;
    i_01 = 0;
    i = 0;
    index = 0;
    local_38 = iVar39;
    do {
      ppAVar23 = JsUtil::
                 BaseDictionary<int,_Js::AsmJsSymbol_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                 ::GetValueAt((BaseDictionary<int,_Js::AsmJsSymbol_*,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
                               *)local_60,index);
      sym = *ppAVar23;
      if (sym == (AsmJsSymbol *)0x0) goto LAB_00946657;
      local_98 = &AsmJsSlot::typeinfo;
      slot = (AsmJsSlot *)0x0;
      local_88 = 0xffffffffffffffff;
      local_80 = 
      "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsModule.cpp"
      ;
      local_78 = 200;
      alloc = Memory::Recycler::TrackAllocInfo
                        (local_58->mCx->scriptContext->recycler,
                         (TrackAllocData *)&stack0xffffffffffffff68);
      local_98 = (undefined **)new<Memory::Recycler>(0x18,alloc,0x776608);
      *local_98 = (undefined *)0x0;
      *(undefined8 *)((long)local_98 + 8) = 0;
      *(undefined8 *)((long)local_98 + 0x10) = 0;
      *(SymbolType *)((long)local_98 + 4) = sym->mType;
      local_34 = sym->mName->m_propertyId;
      JsUtil::
      BaseDictionary<int,Js::AsmJsSlot*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
      ::
      Insert<(JsUtil::BaseDictionary<int,Js::AsmJsSlot*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>::InsertOperations)1>
                ((BaseDictionary<int,Js::AsmJsSlot*,Memory::Recycler,DictionarySizePolicy<PowerOf2Policy,2u,2u,1u,4u>,DefaultComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                  *)exportIter.
                    super_IteratorBase<JsUtil::BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>,_JsUtil::BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>::EntryIterator<JsUtil::BaseDictionary<int,_Js::AsmJsModuleCompiler::AsmJsModuleExport,_Memory::ArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>_>_>
                    ._24_8_,&local_34,(AsmJsSlot **)&stack0xffffffffffffff68);
      switch(sym->mType) {
      case Variable:
        pAVar24 = AsmJsVar::FromSymbol(sym);
        pMVar25 = AsmJsModuleInfo::GetVar(local_40,local_44);
        pMVar25->location = (pAVar24->super_AsmJsVarBase).mLocation;
        local_34 = CONCAT31(local_34._1_3_,
                            (pAVar24->super_AsmJsVarBase).super_AsmJsSymbol.field_0x14);
        WVar16 = AsmJsVarType::which((AsmJsVarType *)&local_34);
        pMVar25->type = WVar16;
        cVar2 = (pAVar24->super_AsmJsVarBase).super_AsmJsSymbol.field_0x14;
        if (cVar2 == '\x03') {
          (pMVar25->initialiser).intInit = (Type)(pAVar24->mConstInitialiser).floatVal;
        }
        else if (cVar2 == '\x02') {
          pMVar25->initialiser = (Type)pAVar24->mConstInitialiser;
        }
        else if (cVar2 == '\0') {
          (pMVar25->initialiser).intInit = (Type)(pAVar24->mConstInitialiser).floatVal;
        }
        else {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar21 = local_50;
          *local_50 = 1;
          bVar15 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsModule.cpp"
                                       ,0xe1,"((0))","UNREACHED");
          if (!bVar15) goto LAB_0094671e;
          *puVar21 = 0;
        }
        local_44 = local_44 + 1;
        iVar18 = (*(pAVar24->super_AsmJsVarBase).super_AsmJsSymbol._vptr_AsmJsSymbol[1])(pAVar24);
        pMVar25->isMutable = SUB41(iVar18,0);
        *(Type *)local_98 = pMVar25->location;
        local_34 = CONCAT31(local_34._1_3_,
                            (pAVar24->super_AsmJsVarBase).super_AsmJsSymbol.field_0x14);
        tVar17 = (type_info)AsmJsVarType::which((AsmJsVarType *)&local_34);
        *(type_info *)((long)local_98 + 8) = tVar17;
        *(byte *)((long)local_98 + 0x10) = pMVar25->isMutable ^ 1;
        break;
      default:
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar21 = local_50;
        *local_50 = 1;
        bVar15 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/AsmJsModule.cpp"
                                     ,0x13c,"((0))","(0)");
        if (bVar15) {
          *puVar21 = 0;
          goto switchD_00946363_caseD_b;
        }
        goto LAB_0094671e;
      case MathConstant:
        pAVar34 = AsmJsMathConst::FromSymbol(sym);
        *(double *)((long)local_98 + 8) = *pAVar34->mVal;
      case ClosureFunction:
switchD_00946363_caseD_b:
        break;
      case ConstantImport:
        pAVar32 = AsmJsConstantImport::FromSymbol(sym);
        pMVar33 = AsmJsModuleInfo::GetVarImport(local_40,i_00);
        pMVar33->location = (pAVar32->super_AsmJsVarBase).mLocation;
        pMVar33->field = pAVar32->mField->m_propertyId;
        local_34 = CONCAT31(local_34._1_3_,
                            (pAVar32->super_AsmJsVarBase).super_AsmJsSymbol.field_0x14);
        tVar17 = (type_info)AsmJsVarType::which((AsmJsVarType *)&local_34);
        pMVar33->type = (Type)tVar17;
        *(Type *)local_98 = pMVar33->location;
        *(type_info *)((long)local_98 + 8) = tVar17;
        iVar39 = local_38;
        i_00 = i_00 + 1;
        break;
      case ImportFunction:
        pAVar27 = AsmJsImportFunction::FromSymbol(sym);
        pMVar28 = AsmJsModuleInfo::GetFunctionImport(local_40,i);
        TVar5 = (pAVar27->super_AsmJsFunctionDeclaration).mLocation;
        pMVar28->location = TVar5;
        pMVar28->field = pAVar27->mField->m_propertyId;
        *(Type *)local_98 = TVar5;
        iVar39 = local_38;
        i = i + 1;
        break;
      case FuncPtrTable:
        pAVar29 = AsmJsFunctionTable::FromSymbol(sym);
        pAVar20 = local_40;
        TVar5 = (pAVar29->super_AsmJsFunctionDeclaration).mLocation;
        uVar38 = pAVar29->mSize;
        AsmJsModuleInfo::SetFunctionTableSize(local_40,TVar5,uVar38);
        local_6c = TVar5;
        pMVar30 = AsmJsModuleInfo::GetFunctionTable(pAVar20,TVar5);
        if ((ulong)uVar38 != 0) {
          local_68 = (FuncInfo *)&pAVar29->mTable;
          uVar40 = 0;
          local_70 = index;
          do {
            if (pAVar29->mSize <= uVar40) {
              AssertCount = AssertCount + 1;
              Throw::LogAssert();
              puVar21 = local_50;
              *local_50 = 1;
              bVar15 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/AsmJsTypes.h"
                                           ,0x2e5,"(index < mSize)","index < mSize");
              if (!bVar15) goto LAB_0094671e;
              *puVar21 = 0;
              index = local_70;
            }
            pTVar31 = JsUtil::
                      List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                      ::Item((List<unsigned_int,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
                              *)local_68,(int)uVar40);
            (pMVar30->moduleFunctionIndex).ptr[uVar40] = *pTVar31;
            uVar40 = uVar40 + 1;
          } while (uVar38 != uVar40);
        }
        *(uint *)((long)local_98 + 8) = uVar38;
        *(Type *)local_98 = local_6c;
        iVar39 = local_38;
        break;
      case ModuleFunction:
        pAVar35 = AsmJsFunc::FromSymbol(sym);
        pMVar36 = AsmJsModuleInfo::GetFunction(local_40,i_01);
        TVar5 = (pAVar35->super_AsmJsFunctionDeclaration).mLocation;
        pMVar36->location = TVar5;
        *(Type *)local_98 = TVar5;
        iVar39 = local_38;
        i_01 = i_01 + 1;
        break;
      case ArrayView:
        pAVar26 = (AsmJsModuleArg *)AsmJsArrayView::FromSymbol(sym);
        goto LAB_009465db;
      case MathBuiltinFunction:
        pAVar37 = AsmJsMathFunction::FromSymbol(sym);
        goto LAB_009465fc;
      case TypedArrayBuiltinFunction:
        pAVar37 = (AsmJsMathFunction *)AsmJsTypedArrayFunction::FromSymbol(sym);
LAB_009465fc:
        *(AsmJSMathBuiltinFunction *)((long)local_98 + 8) = pAVar37->mBuiltIn;
        goto switchD_00946363_caseD_b;
      case ModuleArgument:
        pAVar26 = AsmJsModuleArg::FromSymbol(sym);
LAB_009465db:
        *(undefined1 *)((long)local_98 + 8) = (pAVar26->super_AsmJsSymbol).field_0x14;
        goto switchD_00946363_caseD_b;
      }
LAB_00946657:
      index = index + 1;
    } while (index != iVar39);
  }
  return true;
}

Assistant:

bool AsmJsModuleCompiler::CommitModule()
    {
        FuncInfo* funcInfo = GetModuleFunctionNode()->funcInfo;
        FunctionBody* functionBody = funcInfo->GetParsedFunctionBody();
        AsmJsModuleInfo* asmInfo = functionBody->AllocateAsmJsModuleInfo();

        if (funcInfo->byteCodeFunction->GetIsNamedFunctionExpression())
        {
            Assert(GetModuleFunctionNode()->pnodeName);
            Assert(GetModuleFunctionNode()->pnodeName->nop == knopVarDecl);
            ParseNodeVar * nameNode = GetModuleFunctionNode()->pnodeName;
            if (nameNode->sym->IsInSlot(GetByteCodeGenerator(), funcInfo))
            {
                GetByteCodeGenerator()->AssignPropertyId(nameNode->name());
                // if module is a named function expression, we may need to restore this for debugger
                AsmJsClosureFunction* closure = Anew(&mAllocator, AsmJsClosureFunction, nameNode->pid, AsmJsSymbol::ClosureFunction, &mAllocator);
                DefineIdentifier(nameNode->pid, closure);
            }
        }

        int argCount = 0;
        if (mBufferArgName)
        {
            argCount = 3;
        }
        else if (mForeignArgName)
        {
            argCount = 2;
        }
        else if (mStdLibArgName)
        {
            argCount = 1;
        }

        const int functionCount = mFunctionArray.Count();
        const int functionTableCount = mFunctionTableArray.Count();
        const int importFunctionCount = mImportFunctions.GetTotalVarCount();
        asmInfo->SetFunctionCount(functionCount);
        asmInfo->SetFunctionTableCount(functionTableCount);
        asmInfo->SetFunctionImportCount(importFunctionCount);
        asmInfo->SetVarCount(mVarCount);
        asmInfo->SetVarImportCount(mVarImportCount);
        asmInfo->SetArgInCount(argCount);
        asmInfo->SetModuleMemory(mModuleMemory);
        asmInfo->SetAsmMathBuiltinUsed(mAsmMathBuiltinUsedBV);
        asmInfo->SetAsmArrayBuiltinUsed(mAsmArrayBuiltinUsedBV);
        asmInfo->SetMaxHeapAccess(mMaxHeapAccess);
        int varCount = 3; // 3 possible arguments

        functionBody->SetInParamsCount(4); // Always set 4 inParams so the memory space is the same (globalEnv,stdlib,foreign,buffer)
        functionBody->SetReportedInParamsCount(4);
        functionBody->CheckAndSetConstantCount(2); // Return register + Root
        functionBody->CreateConstantTable();
        functionBody->CheckAndSetVarCount(varCount);
        functionBody->SetIsAsmjsMode(true);
        functionBody->NewObjectLiteral(); // allocate one object literal for the export object

        AsmJSByteCodeGenerator::EmitEmptyByteCode(funcInfo, GetByteCodeGenerator(), GetModuleFunctionNode());

        // Create export module proxy
        asmInfo->SetExportFunctionIndex(mExportFuncIndex);
        asmInfo->SetExportsCount(mExports.Count());
        auto exportIter = mExports.GetIterator();

        for (int exportIndex = 0; exportIter.IsValid(); ++exportIndex)
        {
            const AsmJsModuleExport& exMod = exportIter.CurrentValue();
            auto ex = asmInfo->GetExport(exportIndex);
            *ex.id = exMod.id;
            *ex.location = exMod.location;
            exportIter.MoveNext();
        }

        int iVar = 0, iVarImp = 0, iFunc = 0, iFuncImp = 0;
        const int moduleEnvCount = mModuleEnvironment.Count();
        asmInfo->InitializeSlotMap(moduleEnvCount);
        auto slotMap = asmInfo->GetAsmJsSlotMap();
        for (int i = 0; i < moduleEnvCount; i++)
        {
            AsmJsSymbol* sym = mModuleEnvironment.GetValueAt(i);
            if (sym)
            {
                AsmJsSlot * slot = RecyclerNewLeaf(GetScriptContext()->GetRecycler(), AsmJsSlot);
                slot->symType = sym->GetSymbolType();
                slotMap->AddNew(sym->GetName()->GetPropertyId(), slot);
                switch (sym->GetSymbolType())
                {
                case AsmJsSymbol::Variable:
                {
                    AsmJsVar* var = AsmJsVar::FromSymbol(sym);
                    auto& modVar = asmInfo->GetVar(iVar++);
                    modVar.location = var->GetLocation();
                    modVar.type = var->GetVarType().which();
                    if (var->GetVarType().isInt())
                    {
                        modVar.initialiser.intInit = var->GetIntInitialiser();
                    }
                    else if (var->GetVarType().isFloat())
                    {
                        modVar.initialiser.floatInit = var->GetFloatInitialiser();
                    }
                    else if (var->GetVarType().isDouble())
                    {
                        modVar.initialiser.doubleInit = var->GetDoubleInitialiser();
                    }
                    else
                    {
                        Assert(UNREACHED);
                    }

                    modVar.isMutable = var->isMutable();

                    slot->location = modVar.location;
                    slot->varType = var->GetVarType().which();
                    slot->isConstVar = !modVar.isMutable;
                    break;
                }
                case AsmJsSymbol::ConstantImport:
                {
                    AsmJsConstantImport* var = AsmJsConstantImport::FromSymbol(sym);
                    auto& modVar = asmInfo->GetVarImport(iVarImp++);
                    modVar.location = var->GetLocation();
                    modVar.field = var->GetField()->GetPropertyId();
                    modVar.type = var->GetVarType().which();

                    slot->location = modVar.location;
                    slot->varType = modVar.type;
                    break;
                }
                case AsmJsSymbol::ImportFunction:
                {
                    AsmJsImportFunction* func = AsmJsImportFunction::FromSymbol(sym);
                    auto& modVar = asmInfo->GetFunctionImport(iFuncImp++);
                    modVar.location = func->GetFunctionIndex();
                    modVar.field = func->GetField()->GetPropertyId();

                    slot->location = modVar.location;
                    break;
                }
                case AsmJsSymbol::FuncPtrTable:
                {
                    AsmJsFunctionTable* funcTable = AsmJsFunctionTable::FromSymbol(sym);
                    const uint size = funcTable->GetSize();
                    const RegSlot index = funcTable->GetFunctionIndex();
                    asmInfo->SetFunctionTableSize(index, size);
                    auto& modTable = asmInfo->GetFunctionTable(index);
                    for (uint j = 0; j < size; j++)
                    {
                        modTable.moduleFunctionIndex[j] = funcTable->GetModuleFunctionIndex(j);
                    }
                    slot->funcTableSize = size;
                    slot->location = index;

                    break;
                }
                case AsmJsSymbol::ModuleFunction:
                {
                    AsmJsFunc* func = AsmJsFunc::FromSymbol(sym);
                    auto& modVar = asmInfo->GetFunction(iFunc++);
                    modVar.location = func->GetFunctionIndex();
                    slot->location = modVar.location;
                    break;
                }
                case AsmJsSymbol::ArrayView:
                {
                    AsmJsArrayView * var = AsmJsArrayView::FromSymbol(sym);
                    slot->viewType = var->GetViewType();
                    break;
                }
                case AsmJsSymbol::ModuleArgument:
                {
                    AsmJsModuleArg * arg = AsmJsModuleArg::FromSymbol(sym);
                    slot->argType = arg->GetArgType();
                    break;
                }
                // used only for module validation
                case AsmJsSymbol::MathConstant:
                {
                    AsmJsMathConst * constVar = AsmJsMathConst::FromSymbol(sym);
                    slot->mathConstVal = *constVar->GetVal();
                    break;
                }
                case AsmJsSymbol::MathBuiltinFunction:
                {
                    AsmJsMathFunction * mathFunc = AsmJsMathFunction::FromSymbol(sym);
                    slot->builtinMathFunc = mathFunc->GetMathBuiltInFunction();
                    break;
                }
                case AsmJsSymbol::TypedArrayBuiltinFunction:
                {
                    AsmJsTypedArrayFunction * mathFunc = AsmJsTypedArrayFunction::FromSymbol(sym);
                    slot->builtinArrayFunc = mathFunc->GetArrayBuiltInFunction();
                    break;
                }
                case AsmJsSymbol::ClosureFunction:
                    // we don't need to store any additional info in this case
                    break;
                default:
                    Assume(UNREACHED);
                }
            }
        }
        return true;
    }